

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::lf_heterogeneous_queue_basic_tests(ostream *i_ostream)

{
  consistency_model relaxed;
  consistency_model seq_cst;
  concurrency_cardinality single;
  concurrency_cardinality mult;
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  dur.m_start_time.__d.__r = (duration)(duration)i_ostream;
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)&single,i_ostream,"lock-free heterogeneous queue basic tests");
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::tests((ostream *)dur.m_start_time.__d.__r);
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&single);
  return;
}

Assistant:

void lf_heterogeneous_queue_basic_tests(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "lock-free heterogeneous queue basic tests");

        constexpr auto mult    = density::concurrency_multiple;
        constexpr auto single  = density::concurrency_single;
        constexpr auto seq_cst = density::consistency_sequential;
        constexpr auto relaxed = density::consistency_relaxed;

        NbQueueBasicTests<mult, mult, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<single, mult, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<mult, single, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<single, single, seq_cst>::tests(i_ostream);

        NbQueueBasicTests<mult, mult, relaxed>::tests(i_ostream);
        NbQueueBasicTests<single, mult, relaxed>::tests(i_ostream);
        NbQueueBasicTests<mult, single, relaxed>::tests(i_ostream);
        NbQueueBasicTests<single, single, relaxed>::tests(i_ostream);
    }